

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O2

void __thiscall GMESong::~GMESong(GMESong *this)

{
  ~GMESong(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

GMESong::~GMESong()
{
	Stop();
	if (m_Stream != NULL)
	{
		delete m_Stream;
		m_Stream = NULL;
	}
	if (TrackInfo != NULL)
	{
		gme_free_info(TrackInfo);
	}
	if (Emu != NULL)
	{
		gme_delete(Emu);
	}
}